

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall bwtil::cw_bwt::initStructures(cw_bwt *this)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  ulint uVar6;
  cw_bwt *in_RDI;
  undefined1 auVar10 [16];
  __type _Var7;
  __type _Var8;
  double dVar9;
  undefined1 auVar11 [64];
  ulint i_5;
  ulint i_4;
  double exp_height;
  uint b;
  uint d;
  uint log2n;
  uint nr_of_leaves;
  ulint exp_context_length;
  uint pos;
  ulint i_3;
  ulint i_2;
  ulint max;
  vector<unsigned_long,_std::allocator<unsigned_long>_> stats;
  ulint tot_intervals;
  ulint step;
  ulint max_len;
  uint number_of_intervals;
  int last_perc;
  int perc;
  ulint symbols_read;
  symbol s;
  ulint i_1;
  ulint i;
  undefined7 in_stack_fffffffffffffc38;
  symbol in_stack_fffffffffffffc3f;
  ContextAutomata *in_stack_fffffffffffffc40;
  allocator_type *in_stack_fffffffffffffc48;
  cw_bwt *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  *in_stack_fffffffffffffc60;
  cw_bwt *in_stack_fffffffffffffc70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  ostream *in_stack_fffffffffffffca0;
  PartialSums *this_00;
  ulong local_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf8;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_fffffffffffffe00;
  ulong local_158;
  undefined1 local_149 [41];
  int local_120;
  int local_11c;
  ulong local_118;
  undefined4 local_10c;
  ulong local_108;
  ulong local_100;
  value_type local_f8;
  undefined8 local_e8;
  undefined8 local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  long local_a0;
  symbol local_91;
  ulong local_90;
  undefined8 local_60;
  ulong local_40;
  undefined1 extraout_var [56];
  
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x15e93f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
           (allocator_type *)in_stack_fffffffffffffc50);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffffc50,
              (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffffc48);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_fffffffffffffc50);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x15e994);
  for (local_40 = 0; local_40 < in_RDI->number_of_contexts; local_40 = local_40 + 1) {
    local_60 = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15e9f0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58,&in_stack_fffffffffffffc50->number_of_contexts,
               in_stack_fffffffffffffc48);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&in_RDI->frequencies,local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc48);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15ea5d);
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15eaea);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,(allocator_type *)in_stack_fffffffffffffc50);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15eb3f);
  for (local_90 = 0; local_90 < in_RDI->number_of_contexts; local_90 = local_90 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->lengths,local_90);
    *pvVar3 = 0;
  }
  local_a0 = 0;
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "\n*** Scanning input file to compute context frequencies ***");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  local_a8 = -1;
  while( true ) {
    iVar2 = (*in_RDI->bwIt->_vptr_BackwardIterator[4])();
    if ((((byte)iVar2 ^ 0xff) & 1) == 0) break;
    (*in_RDI->bwIt->_vptr_BackwardIterator[3])();
    local_91 = ContextAutomata::ASCIItoCode(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3f);
    uVar6 = ContextAutomata::currentState(&in_RDI->ca);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->lengths,uVar6);
    *pvVar3 = *pvVar3 + 1;
    uVar6 = ContextAutomata::currentState(&in_RDI->ca);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&in_RDI->frequencies,uVar6);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffc40,
                        CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
    vVar1 = *pvVar3;
    uVar6 = ContextAutomata::currentState(&in_RDI->ca);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&in_RDI->frequencies,uVar6);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffc40,
                        CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
    *pvVar3 = vVar1 + 1;
    ContextAutomata::goTo(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3f);
    local_a4 = (int)((ulong)(local_a0 * 100) / in_RDI->n);
    if (((local_a8 < local_a4) && (local_a4 % 5 == 0)) && ((in_RDI->verbose & 1U) != 0)) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a4);
      poVar4 = std::operator<<(poVar4,"% done.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_a8 = local_a4;
    }
    local_a0 = local_a0 + 1;
  }
  uVar6 = ContextAutomata::currentState(&in_RDI->ca);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&in_RDI->lengths,uVar6);
  *pvVar3 = *pvVar3 + 1;
  uVar6 = ContextAutomata::currentState(&in_RDI->ca);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[](&in_RDI->frequencies,uVar6);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffc40,
                      CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
  *pvVar3 = *pvVar3 + 1;
  computeEmpiricalEntropy(in_stack_fffffffffffffc70);
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout," Done.\n");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_ac = 0x14;
  local_b8 = (in_RDI->n * 10) / in_RDI->number_of_contexts;
  local_c0 = local_b8 / SUB168(ZEXT416(0x14),0);
  local_c8 = 0x15;
  local_e8 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15ef82);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,&in_stack_fffffffffffffc50->number_of_contexts,
             in_stack_fffffffffffffc48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15efb6);
  local_f8 = 0;
  for (local_100 = 0; local_100 < in_RDI->number_of_contexts; local_100 = local_100 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->lengths,local_100);
    if (local_f8 < *pvVar3) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->lengths,local_100);
      local_f8 = *pvVar3;
    }
  }
  for (local_108 = 0; local_108 < in_RDI->number_of_contexts; local_108 = local_108 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->lengths,local_108);
    if (*pvVar3 < local_b8) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->lengths,local_108);
      local_10c = (undefined4)(*pvVar3 / local_c0);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc40,
                          CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc40,
                          CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
      *pvVar3 = vVar1 + 1;
    }
    else {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc40,
                          CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc40,
                          CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
      *pvVar3 = vVar1 + 1;
    }
  }
  local_118 = in_RDI->n / in_RDI->number_of_contexts;
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout," Expected context size (if uniform text) is ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_118);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_11c = (int)(local_118 >> 0xc) + 1;
  auVar11._0_8_ = std::log2<unsigned_long>(0x15f2d2);
  auVar11._8_56_ = extraout_var;
  local_120 = vcvttsd2usi_avx512f(auVar11._0_16_);
  local_149._37_4_ = (undefined4)(0x100 / (ulong)(local_120 + 1));
  auVar10._0_8_ = std::sqrt<unsigned_int>(local_149._37_4_);
  auVar10._8_8_ = 0;
  local_149._33_4_ = vcvttsd2usi_avx512f(auVar10);
  if ((uint)local_149._33_4_ < 2) {
    local_149._33_4_ = 2;
  }
  _Var7 = std::log2<unsigned_int>(0);
  _Var8 = std::log2<unsigned_int>(0);
  local_149._25_8_ = _Var7 / _Var8;
  if ((double)local_149._25_8_ <= 0.0) {
    local_149._25_8_ = 1.0;
  }
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             " Expected worst-case packed B-tree height (if uniform text) is ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,(double)local_149._25_8_);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "\n*** Creating data structures (dynamic compressed strings and partial sums) ***"
                            );
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  local_a4 = 0;
  local_a8 = -1;
  uVar6 = in_RDI->number_of_contexts;
  this_00 = (PartialSums *)local_149;
  std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>::
  allocator((allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
             *)0x15f497);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::vector(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
           (allocator_type *)in_stack_fffffffffffffc50);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::operator=((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)in_stack_fffffffffffffc50,
              (vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)in_stack_fffffffffffffc48);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             *)in_stack_fffffffffffffc50);
  std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>::
  ~allocator((allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
              *)0x15f4e6);
  for (local_158 = 0; local_158 < in_RDI->number_of_contexts; local_158 = local_158 + 1) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&in_RDI->frequencies,local_158);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc90,
               in_stack_fffffffffffffc88);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::operator[](&in_RDI->dynStrings,local_158);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::operator=
              ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
               in_stack_fffffffffffffc40,
               (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
               CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::~DynamicString
              ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
               in_stack_fffffffffffffc40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&in_RDI->frequencies,local_158);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x15f5ba);
    local_a4 = (int)((local_158 * 100) / in_RDI->number_of_contexts);
    if (((local_a8 < local_a4) && (local_a4 % 10 == 0)) && ((in_RDI->verbose & 1U) != 0)) {
      in_stack_fffffffffffffca0 = std::operator<<((ostream *)&std::cout," ");
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffca0,local_a4);
      in_stack_fffffffffffffc90 = std::operator<<(poVar4,"% done.");
      std::ostream::operator<<(in_stack_fffffffffffffc90,std::endl<char,std::char_traits<char>>);
      local_a8 = local_a4;
    }
  }
  computeActualEntropy(in_stack_fffffffffffffc50);
  std::allocator<bwtil::PartialSums>::allocator((allocator<bwtil::PartialSums> *)0x15f71d);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             (allocator_type *)in_stack_fffffffffffffc50);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::operator=
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)
             in_stack_fffffffffffffc50,
             (vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)
             in_stack_fffffffffffffc48);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)
             in_stack_fffffffffffffc50);
  std::allocator<bwtil::PartialSums>::~allocator((allocator<bwtil::PartialSums> *)0x15f76c);
  for (local_220 = 0; local_220 < in_RDI->number_of_contexts; local_220 = local_220 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&in_RDI->lengths,local_220);
    PartialSums::PartialSums(this_00,(uint)(uVar6 >> 0x20),(ulint)in_stack_fffffffffffffca0);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::operator[]
              (&in_RDI->partial_sums,local_220);
    PartialSums::operator=
              ((PartialSums *)in_stack_fffffffffffffc40,
               (PartialSums *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
    PartialSums::~PartialSums((PartialSums *)0x15f806);
  }
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\n k-th order empirical entropy of the text is "
                            );
    dVar9 = empiricalEntropy(in_RDI);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar9);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout," bits per symbol used (only compressed text): ")
    ;
    in_stack_fffffffffffffc50 = (cw_bwt *)actualEntropy(in_RDI);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,(double)in_stack_fffffffffffffc50);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((in_RDI->verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\nData structures created.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc50);
  return;
}

Assistant:

void initStructures(){

		frequencies = vector<vector<ulint> >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			frequencies[i] = vector<ulint>(sigma,0);

		lengths = vector<ulint>(number_of_contexts);

		for(ulint i=0;i<number_of_contexts;i++)
			lengths[i]=0;

		symbol s;

		ulint symbols_read=0;

		if(verbose) cout << "\n*** Scanning input file to compute context frequencies ***" << endl << endl;

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			s = ca.ASCIItoCode( bwIt->read() );//this symbol has as context the current state of the automata

			lengths[ ca.currentState() ]++;//new symbol in this context:increment

			frequencies[ ca.currentState() ].at(s) = frequencies[ ca.currentState() ].at(s)+1;//increment the frequency of s in the context

			ca.goTo(s);

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}
			symbols_read++;

		}

		lengths[ ca.currentState() ]++;//first context in the text: will contain only terminator
		frequencies[ ca.currentState() ].at(0)++;//terminator

		computeEmpiricalEntropy();

		if(verbose) cout << " Done.\n" << endl;

		//99 intervals [i,i+100M/100] and one final interval i>100M

		//statistics:
		uint number_of_intervals = 20;
		ulint max_len = (10*n)/number_of_contexts;
		ulint step = max_len / number_of_intervals;
		ulint tot_intervals = number_of_intervals+1;

		vector<ulint> stats = vector<ulint>(tot_intervals,0);

		ulint max=0;
		for(ulint i=0;i<number_of_contexts;i++)
			if(lengths[i]>max)
				max=lengths[i];

		for(ulint i=0;i<number_of_contexts;i++){

			if(lengths[i]>=max_len)
				stats.at(tot_intervals-1) = stats.at(tot_intervals-1)+1;
			else{

				uint pos=lengths[i]/step;
				stats.at(pos) = stats.at(pos)+1;

			}

		}

		ulint exp_context_length = n/number_of_contexts;

		//if(verbose) cout << " Largest context has " << max << " characters" << endl;
		if(verbose) cout << " Expected context size (if uniform text) is " << exp_context_length << " characters" << endl;

		//compute expected packed B-tree height

		{

			uint nr_of_leaves = exp_context_length/W_leafs + 1;
			uint log2n = log2(exp_context_length+1);
			uint d = W_nodes/(log2n+1);
			uint b = sqrt(d); //worst-case tree fanout
			if(b<=1) b=2;
			double exp_height = (log2(nr_of_leaves)/log2(b));
			if(exp_height<=0) exp_height = 1;

			if(verbose) cout << " Expected worst-case packed B-tree height (if uniform text) is " << exp_height << endl ;

		}

		/*if(verbose) cout << " Context length statistics: " << endl;

		if(verbose){

			for(uint i=0;i<tot_intervals-1;i++)
				cout << " [" << i*step << ", " << (i+1)*step << "[ -> " << stats.at(i)<<endl;

			cout << " [ " << max_len <<", inf [ -> " << stats.at(tot_intervals-1)<<endl;

		}*/


		if(verbose) cout << "\n*** Creating data structures (dynamic compressed strings and partial sums) ***" << endl << endl;

		perc=0;
		last_perc=-1;

		dynStrings = vector<dynamic_string_t >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++){

			dynStrings[i] = dynamic_string_t(frequencies[i]);
			frequencies[i].clear();//free memory

			perc = (100*i)/number_of_contexts;

			if(perc>last_perc and (perc%10)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

		}

		computeActualEntropy();

		partial_sums = vector<PartialSums>(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			partial_sums[i] = PartialSums(sigma,lengths[i]);

		if(verbose){

			cout << "\n k-th order empirical entropy of the text is " << empiricalEntropy() << endl;
			cout << " bits per symbol used (only compressed text): " << actualEntropy() << endl;

		}

		if(verbose) cout << "\nData structures created." << endl;

	}